

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

SuperclassList * __thiscall
capnp::InterfaceSchema::getSuperclasses
          (SuperclassList *__return_storage_ptr__,InterfaceSchema *this)

{
  RawBrandedSchema *pRVar1;
  StructReader local_78;
  PointerReader local_48;
  
  pRVar1 = (this->super_Schema).raw;
  local_48.pointer = (WirePointer *)pRVar1->generic->encodedNode;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_78,&local_48,(word *)0x0);
  local_48.pointer = local_78.pointers + 4;
  if (local_78.pointerCount < 5) {
    local_78.segment._0_4_ = 0;
    local_78.segment._4_4_ = 0;
    local_78.capTable._0_4_ = 0;
    local_78.capTable._4_4_ = 0;
    local_78.nestingLimit = 0x7fffffff;
    local_48.pointer = (WirePointer *)0x0;
  }
  local_48.segment = (SegmentReader *)CONCAT44(local_78.segment._4_4_,local_78.segment._0_4_);
  local_48.capTable = (CapTableReader *)CONCAT44(local_78.capTable._4_4_,local_78.capTable._0_4_);
  local_48.nestingLimit = local_78.nestingLimit;
  capnp::_::PointerReader::getList
            (&(__return_storage_ptr__->list).reader,&local_48,INLINE_COMPOSITE,(word *)0x0);
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

InterfaceSchema::SuperclassList InterfaceSchema::getSuperclasses() const {
  return SuperclassList(*this, getProto().getInterface().getSuperclasses());
}